

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

dtype __thiscall pybind11::dtype::strip_padding(dtype *this,ssize_t itemsize)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  iterator iVar4;
  iterator iVar5;
  object in_RDX;
  list local_1f0;
  list local_1e8;
  list local_1e0;
  reference local_1d8;
  field_descr *descr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<field_descr,_std::allocator<field_descr>_> *__range2_1;
  list offsets;
  list formats;
  list names;
  dtype local_188;
  PyObject *local_180;
  tuple_accessor local_178;
  undefined1 local_158 [8];
  int_ offset;
  undefined1 local_130 [8];
  dtype format;
  undefined1 local_108 [8];
  tuple spec_fo;
  handle local_e0;
  str name;
  tuple spec;
  handle field;
  undefined1 local_c0 [8];
  iterator __end2;
  iterator __begin2;
  object local_80;
  object *local_78;
  object *__range2;
  vector<field_descr,_std::allocator<field_descr>_> field_descriptors;
  str_attr_accessor local_48;
  dict field_dict;
  ssize_t itemsize_local;
  dtype *this_local;
  
  field_dict.super_object.super_handle.m_ptr = (object)(object)in_RDX.super_handle.m_ptr;
  bVar1 = has_fields((dtype *)itemsize);
  if (bVar1) {
    detail::object_api<pybind11::handle>::attr
              (&local_48,(object_api<pybind11::handle> *)itemsize,"fields");
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<pybind11::dict>
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&stack0xffffffffffffffd8);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_48);
    std::vector<field_descr,_std::allocator<field_descr>_>::vector
              ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    sVar3 = dict::size((dict *)&stack0xffffffffffffffd8);
    std::vector<field_descr,_std::allocator<field_descr>_>::reserve
              ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2,sVar3);
    detail::object_api<pybind11::handle>::attr
              ((str_attr_accessor *)&__begin2.value,
               (object_api<pybind11::handle> *)&stack0xffffffffffffffd8,"items");
    detail::object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                *)&local_80);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&__begin2.value);
    local_78 = &local_80;
    detail::object_api<pybind11::handle>::begin((object_api<pybind11::handle> *)&__end2.value);
    detail::object_api<pybind11::handle>::end((object_api<pybind11::handle> *)local_c0);
    while (bVar1 = pybind11::operator!=((iterator *)&__end2.value,(iterator *)local_c0), bVar1) {
      iterator::operator*((iterator *)&__end2.value);
      pybind11::handle::cast<pybind11::tuple>((handle *)&name);
      pybind11::tuple::operator[]((tuple_accessor *)&spec_fo,(tuple *)&name,0);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::cast<pybind11::str>
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)
                 &stack0xffffffffffffff20);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&spec_fo);
      pybind11::tuple::operator[]((tuple_accessor *)&format,(tuple *)&name,1);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::cast<pybind11::tuple>
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_108);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&format);
      pybind11::tuple::operator[]((tuple_accessor *)&offset,(tuple *)local_108,0);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::cast<pybind11::dtype>
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_130);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&offset);
      pybind11::tuple::operator[](&local_178,(tuple *)local_108,1);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::cast<pybind11::int_>
                ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_158);
      detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_178);
      local_180 = local_e0.m_ptr;
      sVar3 = len(local_e0);
      if ((sVar3 != 0) || (cVar2 = kind((dtype *)local_130), cVar2 != 'V')) {
        dtype::itemsize((dtype *)local_130);
        strip_padding(&local_188,(ssize_t)local_130);
        std::
        vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>
        ::emplace_back<pybind11::str,pybind11::dtype,pybind11::int_>
                  ((vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>
                    *)&__range2,(str *)&stack0xffffffffffffff20,&local_188,(int_ *)local_158);
        ~dtype(&local_188);
      }
      int_::~int_((int_ *)local_158);
      ~dtype((dtype *)local_130);
      pybind11::tuple::~tuple((tuple *)local_108);
      str::~str((str *)&stack0xffffffffffffff20);
      pybind11::tuple::~tuple((tuple *)&name);
      iterator::operator++((iterator *)&__end2.value);
    }
    iterator::~iterator((iterator *)local_c0);
    iterator::~iterator((iterator *)&__end2.value);
    object::~object(&local_80);
    iVar4 = std::vector<field_descr,_std::allocator<field_descr>_>::begin
                      ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    iVar5 = std::vector<field_descr,_std::allocator<field_descr>_>::end
                      ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<pybind11::dtype::strip_padding(long)::field_descr*,std::vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>>,pybind11::dtype::strip_padding(long)::_lambda(pybind11::dtype::strip_padding(long)::field_descr_const&,pybind11::dtype::strip_padding(long)::field_descr_const&)_1_>
              (iVar4._M_current,iVar5._M_current);
    list::list<long,_0>(&formats,0);
    list::list<long,_0>(&offsets,0);
    list::list<long,_0>((list *)&__range2_1,0);
    __end2_1 = std::vector<field_descr,_std::allocator<field_descr>_>::begin
                         ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    descr = (field_descr *)
            std::vector<field_descr,_std::allocator<field_descr>_>::end
                      ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<field_descr_*,_std::vector<field_descr,_std::allocator<field_descr>_>_>
                               *)&descr), bVar1) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<field_descr_*,_std::vector<field_descr,_std::allocator<field_descr>_>_>
                  ::operator*(&__end2_1);
      list::append<pybind11::str>(&formats,&local_1d8->name);
      list::append<pybind11::object>(&offsets,&local_1d8->format);
      list::append<pybind11::int_>((list *)&__range2_1,&local_1d8->offset);
      __gnu_cxx::
      __normal_iterator<field_descr_*,_std::vector<field_descr,_std::allocator<field_descr>_>_>::
      operator++(&__end2_1);
    }
    list::list(&local_1e0,&formats);
    list::list(&local_1e8,&offsets);
    list::list(&local_1f0,(list *)&__range2_1);
    dtype(this,&local_1e0,&local_1e8,&local_1f0,(ssize_t)field_dict.super_object.super_handle.m_ptr)
    ;
    list::~list(&local_1f0);
    list::~list(&local_1e8);
    list::~list(&local_1e0);
    list::~list((list *)&__range2_1);
    list::~list(&offsets);
    list::~list(&formats);
    std::vector<field_descr,_std::allocator<field_descr>_>::~vector
              ((vector<field_descr,_std::allocator<field_descr>_> *)&__range2);
    dict::~dict((dict *)&stack0xffffffffffffffd8);
  }
  else {
    dtype(this,(dtype *)itemsize);
  }
  return (object)(object)this;
}

Assistant:

dtype strip_padding(ssize_t itemsize) {
        // Recursively strip all void fields with empty names that are generated for
        // padding fields (as of NumPy v1.11).
        if (!has_fields()) {
            return *this;
        }

        struct field_descr {
            pybind11::str name;
            object format;
            pybind11::int_ offset;
            field_descr(pybind11::str &&name, object &&format, pybind11::int_ &&offset)
                : name{std::move(name)}, format{std::move(format)}, offset{std::move(offset)} {};
        };
        auto field_dict = attr("fields").cast<dict>();
        std::vector<field_descr> field_descriptors;
        field_descriptors.reserve(field_dict.size());

        for (auto field : field_dict.attr("items")()) {
            auto spec = field.cast<tuple>();
            auto name = spec[0].cast<pybind11::str>();
            auto spec_fo = spec[1].cast<tuple>();
            auto format = spec_fo[0].cast<dtype>();
            auto offset = spec_fo[1].cast<pybind11::int_>();
            if ((len(name) == 0u) && format.kind() == 'V') {
                continue;
            }
            field_descriptors.emplace_back(
                std::move(name), format.strip_padding(format.itemsize()), std::move(offset));
        }

        std::sort(field_descriptors.begin(),
                  field_descriptors.end(),
                  [](const field_descr &a, const field_descr &b) {
                      return a.offset.cast<int>() < b.offset.cast<int>();
                  });

        list names, formats, offsets;
        for (auto &descr : field_descriptors) {
            names.append(std::move(descr.name));
            formats.append(std::move(descr.format));
            offsets.append(std::move(descr.offset));
        }
        return dtype(std::move(names), std::move(formats), std::move(offsets), itemsize);
    }